

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyBlobInit(SyBlob *pBlob,SyMemBackend *pAllocator)

{
  SyMemBackend *pAllocator_local;
  SyBlob *pBlob_local;
  
  pBlob->pBlob = (void *)0x0;
  pBlob->nByte = 0;
  pBlob->mByte = 0;
  pBlob->pAllocator = pAllocator;
  pBlob->nFlags = 0;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobInit(SyBlob *pBlob, SyMemBackend *pAllocator)
{
#if defined(UNTRUST)
	if( pBlob == 0  ){
		return SXERR_EMPTY;
	}
#endif
	pBlob->pBlob = 0;
	pBlob->mByte = pBlob->nByte	= 0;
	pBlob->pAllocator = &(*pAllocator);
	pBlob->nFlags = 0;
	return SXRET_OK;
}